

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void linenoiseRefreshLine(void)

{
  if (mlmode == 0) {
    refreshSingleLine(&ls);
  }
  else {
    refreshMultiLine(&ls);
  }
  return;
}

Assistant:

void linenoiseRefreshLine(void) {
    if (mlmode)
        refreshMultiLine(&ls);
    else
        refreshSingleLine(&ls);
}